

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSReportedWaypointPosition.c
# Opt level: O2

void FANSReportedWaypointPosition_1_inherit_TYPE_descriptor(asn_TYPE_descriptor_t *td)

{
  asn_struct_print_f *paVar1;
  ber_type_decoder_f *pbVar2;
  xer_type_decoder_f *pxVar3;
  per_type_decoder_f *ppVar4;
  
  paVar1 = asn_DEF_FANSPosition.print_struct;
  td->free_struct = asn_DEF_FANSPosition.free_struct;
  td->print_struct = paVar1;
  pbVar2 = asn_DEF_FANSPosition.ber_decoder;
  td->check_constraints = asn_DEF_FANSPosition.check_constraints;
  td->ber_decoder = pbVar2;
  pxVar3 = asn_DEF_FANSPosition.xer_decoder;
  td->der_encoder = asn_DEF_FANSPosition.der_encoder;
  td->xer_decoder = pxVar3;
  ppVar4 = asn_DEF_FANSPosition.uper_decoder;
  td->xer_encoder = asn_DEF_FANSPosition.xer_encoder;
  td->uper_decoder = ppVar4;
  td->uper_encoder = asn_DEF_FANSPosition.uper_encoder;
  if (td->per_constraints == (asn_per_constraints_t *)0x0) {
    td->per_constraints = asn_DEF_FANSPosition.per_constraints;
  }
  td->elements = asn_DEF_FANSPosition.elements;
  td->elements_count = asn_DEF_FANSPosition.elements_count;
  td->specifics = asn_DEF_FANSPosition.specifics;
  return;
}

Assistant:

static void
FANSReportedWaypointPosition_1_inherit_TYPE_descriptor(asn_TYPE_descriptor_t *td) {
	td->free_struct    = asn_DEF_FANSPosition.free_struct;
	td->print_struct   = asn_DEF_FANSPosition.print_struct;
	td->check_constraints = asn_DEF_FANSPosition.check_constraints;
	td->ber_decoder    = asn_DEF_FANSPosition.ber_decoder;
	td->der_encoder    = asn_DEF_FANSPosition.der_encoder;
	td->xer_decoder    = asn_DEF_FANSPosition.xer_decoder;
	td->xer_encoder    = asn_DEF_FANSPosition.xer_encoder;
	td->uper_decoder   = asn_DEF_FANSPosition.uper_decoder;
	td->uper_encoder   = asn_DEF_FANSPosition.uper_encoder;
	if(!td->per_constraints)
		td->per_constraints = asn_DEF_FANSPosition.per_constraints;
	td->elements       = asn_DEF_FANSPosition.elements;
	td->elements_count = asn_DEF_FANSPosition.elements_count;
	td->specifics      = asn_DEF_FANSPosition.specifics;
}